

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

int __thiscall io_buf::init(io_buf *this,EVP_PKEY_CTX *ctx)

{
  char **ppcVar1;
  size_t s;
  size_t in_stack_00000158;
  v_array<char> *in_stack_00000160;
  char *local_88;
  char *local_80;
  char *local_78;
  size_t local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  size_t local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  size_t local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  size_t local_10;
  
  v_init<char>();
  (this->space)._begin = local_28;
  (this->space)._end = local_20;
  (this->space).end_array = local_18;
  (this->space).erase_count = local_10;
  v_init<int>();
  (this->files)._begin = local_48;
  (this->files)._end = local_40;
  (this->files).end_array = local_38;
  (this->files).erase_count = local_30;
  v_init<char>();
  (this->currentname)._begin = local_68;
  (this->currentname)._end = local_60;
  (this->currentname).end_array = local_58;
  (this->currentname).erase_count = local_50;
  v_init<char>();
  (this->finalname)._begin = local_88;
  (this->finalname)._end = local_80;
  (this->finalname).end_array = local_78;
  (this->finalname).erase_count = local_70;
  v_array<char>::resize(in_stack_00000160,in_stack_00000158);
  this->current = 0;
  this->count = 0;
  ppcVar1 = v_array<char>::begin(&this->space);
  this->head = *ppcVar1;
  this->_verify_hash = false;
  this->_hash = 0;
  return (int)this;
}

Assistant:

void init()
  {
    space = v_init<char>();
    files = v_init<int>();
    currentname = v_init<char>();
    finalname = v_init<char>();
    size_t s = 1 << 16;
    space.resize(s);
    current = 0;
    count = 0;
    head = space.begin();
    _verify_hash = false;
    _hash = 0;
  }